

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

bool hanabi_learning_env::ParameterValue<bool>
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *params,string *key,bool default_value)

{
  int iVar1;
  const_iterator cVar2;
  char *pcVar3;
  
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&params->_M_h,key);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pcVar3 = (char *)((long)cVar2.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x28);
    iVar1 = std::__cxx11::string::compare(pcVar3);
    default_value = true;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare(pcVar3);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare(pcVar3);
        default_value = iVar1 == 0;
      }
    }
  }
  return default_value;
}

Assistant:

bool ParameterValue<bool>(
    const std::unordered_map<std::string, std::string>& params,
    const std::string& key, bool default_value) {
  auto iter = params.find(key);
  if (iter == params.end()) {
    return default_value;
  }

  return (iter->second == "1" || iter->second == "true" ||
                  iter->second == "True"
              ? true
              : false);
}